

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

QList<QCborArray> * __thiscall QFactoryLoader::metaDataKeys(QFactoryLoader *this)

{
  QLatin1StringView iid_00;
  QLatin1StringView key;
  QByteArrayView raw;
  bool bVar1;
  undefined1 uVar2;
  char *s;
  Private *this_00;
  qsizetype sz;
  const_iterator o;
  QStaticPlugin *this_01;
  Private *in_RSI;
  QList<QCborArray> *in_RDI;
  long in_FS_OFFSET;
  QStaticPlugin *plugin;
  QList<QStaticPlugin> *__range1_1;
  unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *library;
  vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
  *__range1;
  QList<QCborArray> *metaData;
  QFactoryLoaderMetaDataKeysExtractor extractor;
  QByteArrayView pluginData;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QList<QStaticPlugin> staticPlugins;
  QLatin1StringView iid;
  const_iterator __end1;
  const_iterator __begin1;
  QCborValue md;
  QMutexLocker<QMutex> locker;
  QFactoryLoaderMetaDataKeysExtractor *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  QtPluginMetaDataKeys in_stack_fffffffffffffe34;
  IterationResult in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe48;
  qsizetype in_stack_fffffffffffffe50;
  QCborValue *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 uVar3;
  byte bVar4;
  const_iterator cVar5;
  const_iterator local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QLatin1String local_78;
  unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *local_60;
  __normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
  local_58 [4];
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QCborArray *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QCborArray>::QList((QList<QCborArray> *)0x4444cb);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  Private::operator->(in_RSI);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (QMutex *)in_stack_fffffffffffffe28);
  Private::operator->(in_RSI);
  local_58[0]._M_current =
       (unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)&DAT_aaaaaaaaaaaaaaaa;
  local_58[0]._M_current =
       (unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)
       std::
       vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
       ::begin((vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  local_60 = (unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)&DAT_aaaaaaaaaaaaaaaa;
  local_60 = (unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)
             std::
             vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
             ::end((vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            (__normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
                             *)in_stack_fffffffffffffe28), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
    ::operator*(local_58);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>::operator->
              ((unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)0x4445f5);
    QPluginParsedMetaData::value
              ((QPluginParsedMetaData *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffe38,
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    key.m_data = (char *)in_stack_fffffffffffffe58;
    key.m_size = in_stack_fffffffffffffe50;
    ::QCborValue::operator[]
              ((QCborValue *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),key);
    ::QCborValue::toArray(in_stack_fffffffffffffe58);
    QList<QCborArray>::append
              ((QList<QCborArray> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (rvalue_ref)in_stack_fffffffffffffe28);
    QCborArray::~QCborArray((QCborArray *)0x444690);
    ::QCborValue::~QCborValue
              ((QCborValue *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    ::QCborValue::~QCborValue
              ((QCborValue *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
    ::operator++(local_58);
  }
  local_78.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.m_data = &DAT_aaaaaaaaaaaaaaaa;
  Private::operator->(in_RSI);
  s = QByteArray::constData((QByteArray *)0x444798);
  this_00 = Private::operator->(in_RSI);
  sz = QByteArray::size(&this_00->iid);
  QLatin1String::QLatin1String(&local_78,s,sz);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QPluginLoader::staticPlugins();
  local_a0.i = (QStaticPlugin *)&DAT_aaaaaaaaaaaaaaaa;
  local_a0 = QList<QStaticPlugin>::begin
                       ((QList<QStaticPlugin> *)
                        CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  o = QList<QStaticPlugin>::end
                ((QList<QStaticPlugin> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  while (cVar5.i = o.i, uVar2 = QList<QStaticPlugin>::const_iterator::operator!=(&local_a0,o),
        (bool)uVar2) {
    this_01 = QList<QStaticPlugin>::const_iterator::operator*(&local_a0);
    QByteArrayView::QByteArrayView<char,_true>
              ((QByteArrayView *)this_01,(char *)in_stack_fffffffffffffe38,
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    iid_00.m_data._0_7_ = in_stack_fffffffffffffe48;
    iid_00.m_size = (qsizetype)this_01;
    iid_00.m_data._7_1_ = uVar2;
    anon_unknown.dwarf_831166::QFactoryLoaderMetaDataKeysExtractor::
    QFactoryLoaderMetaDataKeysExtractor(in_stack_fffffffffffffe28,iid_00);
    raw.m_data = (storage_type *)cVar5.i;
    raw.m_size = (qsizetype)o.i;
    in_stack_fffffffffffffe38 =
         iterateInPluginMetaData<(anonymous_namespace)::QFactoryLoaderMetaDataKeysExtractor&>
                   (raw,(QFactoryLoaderMetaDataKeysExtractor *)
                        CONCAT17(uVar3,in_stack_fffffffffffffee0));
    anon_unknown.dwarf_831166::QFactoryLoaderMetaDataKeysExtractor::
    ~QFactoryLoaderMetaDataKeysExtractor((QFactoryLoaderMetaDataKeysExtractor *)0x4449f0);
    QList<QStaticPlugin>::const_iterator::operator++(&local_a0);
    o.i = cVar5.i;
  }
  bVar4 = 1;
  QList<QStaticPlugin>::~QList((QList<QStaticPlugin> *)0x444a19);
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  if ((bVar4 & 1) == 0) {
    QList<QCborArray>::~QList((QList<QCborArray> *)0x444a58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QCborArray> QFactoryLoader::metaDataKeys() const
{
    QList<QCborArray> metaData;
#if QT_CONFIG(library)
    QMutexLocker locker(&d->mutex);
    for (const auto &library : d->libraries) {
        const QCborValue md = library->metaData.value(QtPluginMetaDataKeys::MetaData);
        metaData.append(md["Keys"_L1].toArray());
    }
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const auto staticPlugins = QPluginLoader::staticPlugins();
    for (const QStaticPlugin &plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData),
                                  plugin.rawMetaDataSize);
        QFactoryLoaderMetaDataKeysExtractor extractor{ iid };
        iterateInPluginMetaData(pluginData, extractor);
        if (extractor.matchesIid)
            metaData += std::move(extractor.keys);
    }

    // other portions of the code will cast to int (e.g., keyMap())
    Q_ASSERT(metaData.size() <= std::numeric_limits<int>::max());
    return metaData;
}